

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

QCborValue * __thiscall
QJsonPrivate::Parser::parse(QCborValue *__return_storage_ptr__,Parser *this,QJsonParseError *error)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> *this_00;
  char *pcVar1;
  qint64 qVar2;
  Type TVar3;
  undefined4 uVar4;
  QCborContainerPrivate *__old_val;
  QCborContainerPrivate *pQVar5;
  byte *pbVar6;
  ParseError PVar7;
  byte *pbVar8;
  byte bVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QCborValue result;
  QCborValue local_88;
  QCborValue local_68;
  QCborValue local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = this->json;
  pbVar6 = (byte *)this->end;
  if ((((3 < (long)pbVar6 - (long)pcVar1) && (*pcVar1 == -0x11)) && (pcVar1[1] == -0x45)) &&
     (pcVar1[2] == -0x41)) {
    this->json = pcVar1 + 3;
  }
  local_68.n = 0;
  local_68.container = (QCborContainerPrivate *)0x0;
  local_68._20_4_ = 0xaaaaaaaa;
  uVar4 = local_68._20_4_;
  local_68.t = Undefined;
  local_68._20_4_ = 0xaaaaaaaa;
  pbVar8 = (byte *)this->json;
  bVar10 = pbVar8 < pbVar6;
  if ((bVar10) && (bVar9 = *pbVar8, (char)bVar9 < '!')) {
    while ((pbVar8 = pbVar8 + 1, bVar9 < 0x21 && ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) != 0))
          ) {
      this->json = (char *)pbVar8;
      bVar10 = pbVar8 < pbVar6;
      if ((pbVar8 == pbVar6) || (bVar9 = *pbVar8, ' ' < (char)bVar9)) break;
    }
  }
  PVar7 = IllegalValue;
  if (bVar10) {
    if (*this->json == '\"') {
      pQVar5 = (QCborContainerPrivate *)operator_new(0x40);
      (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      pQVar5->usedData = 0;
      (pQVar5->data).d.d = (Data *)0x0;
      (pQVar5->data).d.ptr = (char *)0x0;
      (pQVar5->data).d.size = 0;
      (pQVar5->elements).d.d = (Data *)0x0;
      (pQVar5->elements).d.ptr = (Element *)0x0;
      (pQVar5->elements).d.size = 0;
      this_00 = &this->container;
      QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(this_00,pQVar5);
      this->json = this->json + 1;
      bVar10 = parseString(this);
      TVar3 = local_68.t;
      qVar2 = local_68.n;
      if (bVar10) {
        pQVar5 = (this_00->d).ptr;
        (this_00->d).ptr = (QCborContainerPrivate *)0x0;
        local_88.n = 0;
        local_88.container = (QCborContainerPrivate *)0x0;
        local_88.t = Undefined;
        local_88._20_4_ = 0xaaaaaaaa;
        local_68.n = 0;
        local_48.n = qVar2;
        local_48.container = local_68.container;
        local_68.t = String;
        local_48._20_4_ = 0xaaaaaaaa;
        local_48.t = TVar3;
        bVar10 = local_68.container != (QCborContainerPrivate *)0x0;
        local_68.container = pQVar5;
        if (bVar10) {
          QCborValue::dispose(&local_48);
        }
        if (local_88.container != (QCborContainerPrivate *)0x0) {
          QCborValue::dispose(&local_88);
        }
LAB_00116018:
        TVar3 = local_68.t;
        pQVar5 = local_68.container;
        pbVar6 = (byte *)this->json;
        pbVar8 = (byte *)this->end;
        if (pbVar6 < pbVar8) {
          do {
            bVar9 = *pbVar6;
            if (((' ' < (char)bVar9) || (0x20 < bVar9)) ||
               ((0x100002600U >> ((ulong)(uint)bVar9 & 0x3f) & 1) == 0)) break;
            pbVar6 = pbVar6 + 1;
            this->json = (char *)pbVar6;
          } while (pbVar6 != pbVar8);
        }
        PVar7 = GarbageAtEnd;
        uVar4 = local_68._20_4_;
        if (pbVar8 <= this->json) {
          if (error != (QJsonParseError *)0x0) {
            error->offset = 0;
            error->error = NoError;
          }
          __return_storage_ptr__->n = local_68.n;
          local_68.container = (QCborContainerPrivate *)0x0;
          __return_storage_ptr__->container = pQVar5;
          local_68.t = Undefined;
          __return_storage_ptr__->t = TVar3;
          goto LAB_0011608f;
        }
        goto LAB_0011605c;
      }
    }
    else {
      local_68._20_4_ = uVar4;
      parseValue(&local_88,this);
      local_48.t = local_68.t;
      local_48.container = local_68.container;
      local_48.n = local_68.n;
      local_68.container = local_88.container;
      local_88.container = (QCborContainerPrivate *)0x0;
      local_68.t = local_88.t;
      local_88.t = Undefined;
      local_68.n = local_88.n;
      local_48._20_4_ = 0xaaaaaaaa;
      if (local_48.container != (QCborContainerPrivate *)0x0) {
        QCborValue::dispose(&local_48);
      }
      if (local_88.container != (QCborContainerPrivate *)0x0) {
        QCborValue::dispose(&local_88);
      }
      if (local_68.t != Undefined) goto LAB_00116018;
    }
  }
  else {
LAB_0011605c:
    local_68._20_4_ = uVar4;
    this->lastError = PVar7;
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            (&this->container,(QCborContainerPrivate *)0x0);
  if (error != (QJsonParseError *)0x0) {
    error->offset = *(int *)&this->json - *(int *)&this->head;
    error->error = this->lastError;
  }
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
LAB_0011608f:
  if (local_68.container != (QCborContainerPrivate *)0x0) {
    QCborValue::dispose(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QCborValue Parser::parse(QJsonParseError *error)
{
    eatBOM();

    char token;
    QCborValue value;

    if (!eatSpace()) {
        lastError = QJsonParseError::IllegalValue;
        goto error;
    }

    token = *json;
    if (token == Quote) {
        container = new QCborContainerPrivate;
        json++;
        if (!parseString())
            goto error;
        value = QCborContainerPrivate::makeValue(QCborValue::String, 0, container.take(),
                                                 QCborContainerPrivate::MoveContainer);
    } else {
        value = parseValue();
        if (value.isUndefined())
            goto error;
    }

    eatSpace();
    if (json < end) {
        lastError = QJsonParseError::GarbageAtEnd;
        goto error;
    }

    {
        if (error) {
            error->offset = 0;
            error->error = QJsonParseError::NoError;
        }

        return value;
    }

error:
    container.reset();
    if (error) {
        error->offset = json - head;
        error->error  = lastError;
    }
    return QCborValue();
}